

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetSP.c
# Opt level: O1

void ResizeQueuePages(void)

{
  int iVar1;
  DdNode ***pppDVar2;
  int iVar3;
  DdNode ***pppDVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  iVar3 = queuePage;
  iVar1 = maxQueuePages;
  lVar7 = (long)queuePage;
  uVar6 = queuePage + 1;
  lVar8 = (long)maxQueuePages;
  pppDVar4 = queuePages;
  queuePage = uVar6;
  if (uVar6 == maxQueuePages) {
    pppDVar4 = (DdNode ***)malloc(lVar8 * 8 + 0x400);
    pppDVar2 = queuePages;
    if (pppDVar4 == (DdNode ***)0x0) {
      pppDVar4 = queuePages;
      if (-1 < iVar3) {
        uVar9 = 0;
        do {
          if (pppDVar2[uVar9] != (DdNode **)0x0) {
            free(pppDVar2[uVar9]);
            pppDVar2[uVar9] = (DdNode **)0x0;
          }
          uVar9 = uVar9 + 1;
          pppDVar4 = queuePages;
        } while (uVar6 != uVar9);
      }
      goto joined_r0x007e4045;
    }
    maxQueuePages = iVar1 + 0x80;
    if (0 < iVar1) {
      lVar5 = 0;
      do {
        pppDVar4[lVar5] = pppDVar2[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar8 != lVar5);
    }
    if (queuePages != (DdNode ***)0x0) {
      free(queuePages);
    }
  }
  queuePages = pppDVar4;
  currentQueuePage = (DdNode **)malloc(0x4000);
  pppDVar4 = queuePages;
  queuePages[lVar7 + 1] = currentQueuePage;
  if (currentQueuePage != (DdNode **)0x0) {
    queuePageIndex = 0;
    return;
  }
  currentQueuePage = (DdNode **)0x0;
  if (-1 < iVar3) {
    uVar9 = 0;
    do {
      if (pppDVar4[uVar9] != (DdNode **)0x0) {
        free(pppDVar4[uVar9]);
        pppDVar4[uVar9] = (DdNode **)0x0;
      }
      uVar9 = uVar9 + 1;
    } while (uVar6 != uVar9);
  }
joined_r0x007e4045:
  if (pppDVar4 != (DdNode ***)0x0) {
    free(pppDVar4);
    queuePages = (DdNode ***)0x0;
  }
  memOut = 1;
  return;
}

Assistant:

static void
ResizeQueuePages(void)
{
    int i;
    DdNode ***newQueuePages;

    queuePage++;
    /* If the current page index is larger than the number of pages
     * allocated, allocate a new page array. Page numbers are incremented by
     * INITIAL_PAGES
     */
    if (queuePage == maxQueuePages) {
        newQueuePages = ABC_ALLOC(DdNode **,maxQueuePages + INITIAL_PAGES);
        if (newQueuePages == NULL) {
            for (i = 0; i < queuePage; i++) ABC_FREE(queuePages[i]);
            ABC_FREE(queuePages);
            memOut = 1;
            return;
        } else {
            for (i = 0; i < maxQueuePages; i++) {
                newQueuePages[i] = queuePages[i];
            }
            /* Increase total page count */
            maxQueuePages += INITIAL_PAGES;
            ABC_FREE(queuePages);
            queuePages = newQueuePages;
        }
    }
    /* Allocate a new page */
    currentQueuePage = queuePages[queuePage] = ABC_ALLOC(DdNode *,queuePageSize);
    if (currentQueuePage == NULL) {
        for (i = 0; i < queuePage; i++) ABC_FREE(queuePages[i]);
        ABC_FREE(queuePages);
        memOut = 1;
        return;
    }
    /* reset page index */
    queuePageIndex = 0;
    return;

}